

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O1

void LoadFileList(Configuration *config,
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
                 *components,
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>_>
                 *files,path *sourceDir,bool inferredComponents,bool withLoc)

{
  byte bVar1;
  _Hash_node_base *__n;
  char cVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  reference pdVar8;
  long lVar9;
  Component *pCVar10;
  ulong uVar11;
  char *pcVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  string *__len;
  void *__s;
  char *pcVar13;
  void *pvVar14;
  undefined1 *puVar15;
  int iVar16;
  uint uVar17;
  size_type sVar18;
  string *__n_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  char cVar20;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  _Hash_node_base *p_Var21;
  undefined4 uVar22;
  _Alloc_hider _Var23;
  bool bVar24;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_false,_true>,_bool>
  pVar25;
  recursive_directory_iterator it;
  string nextLine;
  string line;
  string fileName;
  recursive_directory_iterator end;
  __string_type __str;
  string pathS;
  path outputpath;
  string fileName_1;
  undefined1 *local_508;
  recursive_directory_iterator local_500;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
  local_4f8;
  path local_4f0;
  Configuration *local_4d0;
  string *local_4c8;
  undefined1 *local_4c0;
  string *local_4b8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
  *local_4b0;
  string local_4a8;
  char *local_488;
  ulong local_480;
  char local_478 [16];
  string *local_468;
  intrusive_ptr<boost::filesystem::detail::recur_dir_itr_imp> local_460;
  int local_454;
  undefined4 local_450;
  undefined4 local_44c;
  undefined1 *local_448;
  ulong local_440;
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  undefined8 local_408;
  size_t sStack_400;
  undefined8 local_3f8;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,File>,std::allocator<std::pair<std::__cxx11::string_const,File>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_3f0;
  ios_base *local_3e8;
  _Prime_rehash_policy *local_3e0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_3d8;
  _Prime_rehash_policy *local_3d0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_3c8;
  undefined1 local_3c0 [24];
  error_category local_3a8;
  undefined1 *local_398 [2];
  undefined1 local_388 [16];
  char *local_378 [2];
  char local_368 [16];
  string local_358;
  undefined1 local_338 [32];
  undefined1 *local_318 [2];
  undefined1 local_308 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_2f8;
  _Hashtable<File_*,_File_*,_std::allocator<File_*>,_std::__detail::_Identity,_std::equal_to<File_*>,_std::hash<File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_2c8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_290;
  undefined8 local_238 [33];
  path local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_f0;
  _Hashtable<File_*,_File_*,_std::allocator<File_*>,_std::__detail::_Identity,_std::equal_to<File_*>,_std::hash<File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_c0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_88;
  
  local_450 = (undefined4)CONCAT71(in_register_00000089,withLoc);
  local_44c = (undefined4)CONCAT71(in_register_00000081,inferredComponents);
  local_4d0 = config;
  local_4b0 = components;
  local_3f0 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,File>,std::allocator<std::pair<std::__cxx11::string_const,File>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)files;
  boost::filesystem::detail::current_path((error_code *)&local_130);
  std::__cxx11::string::string
            ((string *)local_338,(sourceDir->m_pathname)._M_dataplus._M_p,
             (allocator *)local_110._M_local_buf);
  boost::filesystem::detail::current_path((path *)local_338,(error_code *)0x0);
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_);
  }
  local_338._0_8_ = local_338 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,".","");
  AddComponentDefinition(local_4b0,(path *)local_338);
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_);
  }
  local_338._0_8_ = local_338 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,".","");
  boost::filesystem::recursive_directory_iterator::recursive_directory_iterator
            (&local_500,(path *)local_338);
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_);
  }
  local_460.px = (recur_dir_itr_imp *)0x0;
  local_3c8 = &(local_4d0->addLibraryAliases)._M_h;
  local_3d0 = &(local_4d0->addLibraryAliases)._M_h._M_rehash_policy;
  local_3e8 = (ios_base *)local_238;
  local_3d8 = &(local_4d0->addExecutableAliases)._M_h;
  local_3e0 = &(local_4d0->addExecutableAliases)._M_h._M_rehash_policy;
  do {
    if ((local_500.m_imp.px ==
         (intrusive_ptr<boost::filesystem::detail::recur_dir_itr_imp>)local_460.px) ||
       (((local_500.m_imp.px == (recur_dir_itr_imp *)0x0 ||
         (*(long *)((long)local_500.m_imp.px + 8) == *(long *)((long)local_500.m_imp.px + 0x10))) &&
        ((local_460.px == (recur_dir_itr_imp *)0x0 ||
         (*(long *)(local_460.px + 8) == *(long *)(local_460.px + 0x10))))))) {
      boost::intrusive_ptr<boost::filesystem::detail::recur_dir_itr_imp>::~intrusive_ptr(&local_460)
      ;
      boost::intrusive_ptr<boost::filesystem::detail::recur_dir_itr_imp>::~intrusive_ptr
                (&local_500.m_imp);
      boost::filesystem::detail::current_path(&local_130,(error_code *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.m_pathname._M_dataplus._M_p != &local_130.m_pathname.field_2) {
        operator_delete(local_130.m_pathname._M_dataplus._M_p);
      }
      return;
    }
    boost::filesystem::recursive_directory_iterator::dereference(&local_500);
    boost::filesystem::path::parent_path();
    boost::filesystem::recursive_directory_iterator::dereference(&local_500);
    boost::filesystem::path::filename();
    local_488 = local_478;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_488,local_338._0_8_,(pointer)(local_338._0_8_ + local_338._8_8_));
    if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
      operator_delete((void *)local_338._0_8_);
    }
    if ((local_480 < 2) || (*local_488 != '.')) {
      pdVar8 = boost::filesystem::recursive_directory_iterator::dereference(&local_500);
      local_338._0_8_ = local_338 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_338,*(long *)pdVar8,*(long *)(pdVar8 + 8) + *(long *)pdVar8);
      boost::filesystem::path::filename();
      local_110._M_allocated_capacity = (size_type)&local_100;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,local_428._M_allocated_capacity,
                 local_428._8_8_ + local_428._M_allocated_capacity);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_allocated_capacity != &local_418) {
        operator_delete((void *)local_428._M_allocated_capacity);
      }
      p_Var21 = (local_4d0->blacklist)._M_h._M_before_begin._M_nxt;
      bVar24 = p_Var21 != (_Hash_node_base *)0x0;
      if (bVar24) {
        bVar24 = true;
        do {
          iVar5 = std::__cxx11::string::compare((ulong)local_338,2,(string *)p_Var21[2]._M_nxt);
          if ((iVar5 == 0) ||
             ((__n = p_Var21[2]._M_nxt, __n == (_Hash_node_base *)local_110._8_8_ &&
              ((__n == (_Hash_node_base *)0x0 ||
               (iVar5 = bcmp(p_Var21[1]._M_nxt,(void *)local_110._M_allocated_capacity,(size_t)__n),
               iVar5 == 0)))))) break;
          p_Var21 = p_Var21->_M_nxt;
          bVar24 = p_Var21 != (_Hash_node_base *)0x0;
        } while (bVar24);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_allocated_capacity != &local_100) {
        operator_delete((void *)local_110._M_allocated_capacity);
      }
      if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
        operator_delete((void *)local_338._0_8_);
      }
      if (bVar24) goto LAB_00126051;
      if ((char)local_44c != '\0') {
        AddComponentDefinition(local_4b0,(path *)(local_3c0 + 8));
      }
      boost::filesystem::recursive_directory_iterator::dereference(&local_500);
      boost::filesystem::path::filename();
      iVar5 = boost::filesystem::path::compare((path *)local_338,"CMakeLists.txt");
      if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
        operator_delete((void *)local_338._0_8_);
      }
      if (iVar5 == 0) {
        pdVar8 = boost::filesystem::recursive_directory_iterator::dereference(&local_500);
        boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
                  ((basic_ifstream<char,_std::char_traits<char>_> *)local_338,(path *)pdVar8);
        local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
        local_4a8._M_string_length = 0;
        local_4a8.field_2._M_local_buf[0] = '\0';
        boost::filesystem::path::parent_path();
        pCVar10 = AddComponentDefinition(local_4b0,&local_4f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0.m_pathname._M_dataplus._M_p != &local_4f0.m_pathname.field_2) {
          operator_delete(local_4f0.m_pathname._M_dataplus._M_p);
        }
        local_4c8 = &pCVar10->additionalCmakeDeclarations;
        local_4b8 = &pCVar10->additionalTargetParameters;
        local_468 = (string *)&pCVar10->name;
        iVar5 = 0;
        local_4f8._M_cur = local_4f8._M_cur & 0xffffffff00000000;
        bVar24 = false;
        do {
          paVar19 = &local_4f0.m_pathname.field_2;
          cVar20 = (char)(istream *)local_338;
          cVar2 = std::ios::widen((char)*(undefined8 *)(local_338._0_8_ + -0x18) + cVar20);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_338,(string *)&local_4a8,cVar2);
          _Var23._M_p = local_4a8._M_dataplus._M_p;
          pcVar13 = strstr(local_4a8._M_dataplus._M_p,(local_4d0->regenTag)._M_dataplus._M_p);
          if (pcVar13 == (char *)0x0) {
            while (_Var23._M_p[local_4a8._M_string_length - 1] == '\\') {
              std::__cxx11::string::pop_back();
              local_4f0.m_pathname._M_string_length = 0;
              local_4f0.m_pathname.field_2._M_local_buf[0] = '\0';
              local_4f0.m_pathname._M_dataplus._M_p = (pointer)paVar19;
              cVar2 = std::ios::widen((char)*(undefined8 *)(local_338._0_8_ + -0x18) + cVar20);
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_338,(string *)&local_4f0,cVar2);
              std::__cxx11::string::_M_append
                        ((char *)&local_4a8,(ulong)local_4f0.m_pathname._M_dataplus._M_p);
              _Var23._M_p = local_4a8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f0.m_pathname._M_dataplus._M_p != paVar19) {
                operator_delete(local_4f0.m_pathname._M_dataplus._M_p);
                _Var23._M_p = local_4a8._M_dataplus._M_p;
              }
            }
            if ((local_4a8._M_string_length == 0) || (*_Var23._M_p != '#')) {
              for (uVar11 = std::__cxx11::string::find((char *)&local_4a8,0x12ed18,0);
                  uVar11 != 0xffffffffffffffff;
                  uVar11 = std::__cxx11::string::find((char *)&local_4a8,0x12ed18,uVar11 + 2)) {
                lVar9 = std::__cxx11::string::find((char *)&local_4a8,0x12ed18,uVar11 + 1);
                std::__cxx11::string::replace
                          ((ulong)&local_4a8,uVar11 + 1,(char *)(~uVar11 + lVar9),0x12e1f6);
              }
              if (local_4a8._M_string_length == 0) {
                iVar6 = 0;
              }
              else {
                sVar18 = 0;
                iVar6 = 0;
                do {
                  iVar6 = iVar6 + (uint)(local_4a8._M_dataplus._M_p[sVar18] == '(');
                  sVar18 = sVar18 + 1;
                } while (local_4a8._M_string_length != sVar18);
              }
              paVar19 = &local_4f0.m_pathname.field_2;
              if (local_4a8._M_string_length == 0) {
                iVar16 = 0;
              }
              else {
                sVar18 = 0;
                iVar16 = 0;
                do {
                  iVar16 = iVar16 + (uint)(local_4a8._M_dataplus._M_p[sVar18] == ')');
                  sVar18 = sVar18 + 1;
                } while (local_4a8._M_string_length != sVar18);
              }
              iVar5 = (iVar6 + iVar5) - iVar16;
              iVar6 = strncmp(local_4a8._M_dataplus._M_p,"project(",8);
              cVar20 = (char)&local_4a8;
              if (iVar6 == 0) {
                lVar9 = std::__cxx11::string::find(cVar20,0x29);
                if (lVar9 != -1) {
                  std::__cxx11::string::substr((ulong)&local_4f0,(ulong)&local_4a8);
                  std::__cxx11::string::operator=(local_468,(string *)&local_4f0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4f0.m_pathname._M_dataplus._M_p != paVar19) {
                    operator_delete(local_4f0.m_pathname._M_dataplus._M_p);
                  }
                }
              }
              else {
                local_110._M_allocated_capacity = 0;
                local_110._8_8_ = (local_4d0->addLibraryAliases)._M_h._M_bucket_count;
                local_100._M_allocated_capacity = 0;
                local_100._8_8_ = (local_4d0->addLibraryAliases)._M_h._M_element_count;
                local_f0._M_impl._0_4_ = local_3d0->_M_max_load_factor;
                local_f0._M_impl._4_4_ = *(undefined4 *)&local_3d0->field_0x4;
                local_f0._M_impl.super__Rb_tree_header._M_header._0_8_ = local_3d0->_M_next_resize;
                local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_4f0.m_pathname._M_dataplus._M_p = (pointer)&local_110;
                std::
                _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                ::
                _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                          ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            *)local_4f0.m_pathname._M_dataplus._M_p,local_3c8,
                           (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                            *)&local_4f0);
                bVar3 = TryGetComponentType(pCVar10,(
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&local_110,&local_4a8);
                std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)&local_110);
                if (!bVar3) {
                  local_428._M_allocated_capacity = 0;
                  local_428._8_8_ = (local_4d0->addExecutableAliases)._M_h._M_bucket_count;
                  local_418._M_allocated_capacity = 0;
                  local_418._8_8_ = (local_4d0->addExecutableAliases)._M_h._M_element_count;
                  local_408 = *(undefined8 *)local_3e0;
                  sStack_400 = local_3e0->_M_next_resize;
                  local_3f8 = 0;
                  local_4f0.m_pathname._M_dataplus._M_p = (pointer)&local_428;
                  std::
                  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  ::
                  _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              *)local_4f0.m_pathname._M_dataplus._M_p,local_3d8,
                             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                              *)&local_4f0);
                  bVar3 = TryGetComponentType(pCVar10,(
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&local_428,&local_4a8);
                  std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                 *)&local_428);
                  if (!bVar3) {
                    if (bVar24) {
                      sVar18 = local_4a8._M_string_length;
                      if (iVar5 == 0) {
                        sVar18 = std::__cxx11::string::rfind(cVar20,0x29);
                      }
                      if (sVar18 != 0) {
                        std::__cxx11::string::substr((ulong)&local_4f0,(ulong)&local_4a8);
                        _Var23._M_p = local_4f0.m_pathname._M_dataplus._M_p;
                        pcVar13 = strstr(local_4f0.m_pathname._M_dataplus._M_p,
                                         "${IMPLEMENTATION_SOURCES}");
                        if ((pcVar13 == (char *)0x0) &&
                           (pcVar13 = strstr(_Var23._M_p,"${IMPLEMENTATION_HEADERS}"),
                           pcVar13 == (char *)0x0)) {
                          local_398[0] = local_388;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)local_398,_Var23._M_p,
                                     (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                      *)(_Var23._M_p + local_4f0.m_pathname._M_string_length));
                          boost::filesystem::path::extension();
                          bVar4 = IsCode(&local_358);
                          bVar4 = !bVar4;
                          bVar3 = true;
                        }
                        else {
                          bVar3 = false;
                          bVar4 = false;
                        }
                        if (bVar3) {
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_358._M_dataplus._M_p != &local_358.field_2) {
                            operator_delete(local_358._M_dataplus._M_p);
                          }
                          if (local_398[0] != local_388) {
                            operator_delete(local_398[0]);
                          }
                        }
                        if (bVar4) {
                          local_448 = local_438;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_448,local_4f0.m_pathname._M_dataplus._M_p,
                                     (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                      *)(local_4f0.m_pathname._M_dataplus._M_p +
                                        local_4f0.m_pathname._M_string_length));
                          std::__cxx11::string::_M_replace_aux((ulong)&local_448,local_440,0,'\x01')
                          ;
                          std::__cxx11::string::_M_append((char *)local_4b8,(ulong)local_448);
                          if (local_448 != local_438) {
                            operator_delete(local_448);
                          }
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_4f0.m_pathname._M_dataplus._M_p != paVar19) {
                          operator_delete(local_4f0.m_pathname._M_dataplus._M_p);
                        }
                      }
                      if (iVar5 == 0) {
                        bVar24 = false;
                      }
                    }
                    else if (local_4d0->reuseCustomSections == true) {
                      local_378[0] = local_368;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)local_378,local_4a8._M_dataplus._M_p,
                                 local_4a8._M_dataplus._M_p + local_4a8._M_string_length);
                      pcVar13 = local_378[0];
                      pcVar12 = strstr(local_378[0],"target_link_libraries(");
                      bVar3 = true;
                      if ((((((pcVar12 == (char *)0x0) &&
                             (pcVar12 = strstr(pcVar13,"add_subdirectory("), pcVar12 == (char *)0x0)
                             ) && (pcVar12 = strstr(pcVar13,"target_include_directories("),
                                  pcVar12 == (char *)0x0)) &&
                           ((pcVar12 = strstr(pcVar13,"add_dependencies("), pcVar12 == (char *)0x0
                            && (pcVar12 = strstr(pcVar13,"include(CMakeAddon.txt)"),
                               pcVar12 == (char *)0x0)))) &&
                          (pcVar12 = strstr(pcVar13,"source_group(\"Implementation\\"),
                          pcVar12 == (char *)0x0)) &&
                         ((pcVar12 = strstr(pcVar13,"set(IMPLEMENTATION_SOURCES"),
                          pcVar12 == (char *)0x0 &&
                          (pcVar12 = strstr(pcVar13,"set(IMPLEMENTATION_HEADERS"),
                          pcVar12 == (char *)0x0)))) {
                        pcVar12 = strstr(pcVar13,"set(INTERFACE_FILES");
                        bVar3 = pcVar12 != (char *)0x0;
                      }
                      if (pcVar13 != local_368) {
                        operator_delete(pcVar13);
                      }
                      uVar7 = 1;
                      if (((!bVar3) &&
                          (uVar7 = (uint)local_4f8._M_cur, ((ulong)local_4f8._M_cur & 1) == 0)) &&
                         (local_4a8._M_string_length != 0)) {
                        local_4f0.m_pathname._M_dataplus._M_p = (pointer)paVar19;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_4f0,local_4a8._M_dataplus._M_p,
                                   local_4a8._M_dataplus._M_p + local_4a8._M_string_length);
                        std::__cxx11::string::_M_replace_aux
                                  ((ulong)&local_4f0,local_4f0.m_pathname._M_string_length,0,'\x01')
                        ;
                        std::__cxx11::string::_M_append
                                  ((char *)local_4c8,(ulong)local_4f0.m_pathname._M_dataplus._M_p);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_4f0.m_pathname._M_dataplus._M_p != paVar19) {
                          operator_delete(local_4f0.m_pathname._M_dataplus._M_p);
                        }
                        uVar7 = (uint)local_4f8._M_cur;
                      }
                      uVar17 = uVar7 & 0xff;
                      if (iVar5 == 0) {
                        uVar17 = 0;
                      }
                      if ((uVar7 & 1) == 0) {
                        uVar17 = uVar7 & 0xff;
                      }
                      local_4f8._M_cur._0_4_ = uVar17;
                    }
                    goto LAB_00126268;
                  }
                }
                bVar24 = true;
              }
            }
          }
          else {
            pCVar10->recreate = true;
          }
LAB_00126268:
        } while (*(int *)((long)local_318 + *(long *)(local_338._0_8_ + -0x18)) == 0);
        if (iVar5 != 0) {
          printf("final level of parentheses=%d\n");
          __assert_fail("parenLevel == 0 || (printf(\"final level of parentheses=%d\\n\", parenLevel), 0)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dascandy[P]cpp-dependencies/src/Input.cpp"
                        ,0x13c,
                        "void ReadCmakelist(const Configuration &, std::unordered_map<std::string, Component *> &, const filesystem::path &)"
                       );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p);
        }
        local_338._0_8_ =
             std::ifstream-in-boost::filesystem::basic_ifstream<char,std::char_traits<char>>::
             construction_vtable + 0x18;
        local_238[0] = 0x137b70;
        std::filebuf::~filebuf((filebuf *)(local_338 + 0x10));
        local_338._0_8_ =
             std::istream-in-boost::filesystem::basic_ifstream<char,std::char_traits<char>>::
             construction_vtable + 0x18;
        local_238[0] = 0x137bc0;
        local_338._8_8_ = 0;
        std::ios_base::~ios_base(local_3e8);
      }
      else {
        boost::filesystem::recursive_directory_iterator::dereference(&local_500);
        boost::filesystem::directory_entry::get_status((error_code *)local_3c0);
        if (local_3c0._0_4_ == 2) {
          pdVar8 = boost::filesystem::recursive_directory_iterator::dereference(&local_500);
          lVar9 = std::__cxx11::string::find((char *)pdVar8,0x12e701,0);
          if (lVar9 == -1) {
            boost::filesystem::recursive_directory_iterator::dereference(&local_500);
            boost::filesystem::path::extension();
            bVar24 = IsCode((string *)local_338);
            if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
              operator_delete((void *)local_338._0_8_);
            }
            if (bVar24) {
              __x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    boost::filesystem::recursive_directory_iterator::dereference(&local_500);
              File::File((File *)&local_110,(path *)__x);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>
              ::pair<File,_true>((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>
                                  *)local_338,__x,(File *)&local_110);
              pVar25 = std::
                       _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,File>,std::allocator<std::pair<std::__cxx11::string_const,File>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                       ::_M_emplace<std::pair<std::__cxx11::string,File>>(local_3f0);
              std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::~_Hashtable(&local_290);
              std::
              _Hashtable<File_*,_File_*,_std::allocator<File_*>,_std::__detail::_Identity,_std::equal_to<File_*>,_std::hash<File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::~_Hashtable(&local_2c8);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              ::~_Rb_tree(&local_2f8);
              if (local_318[0] != local_308) {
                operator_delete(local_318[0]);
              }
              if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
                operator_delete((void *)local_338._0_8_);
              }
              std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::~_Hashtable(&local_88);
              std::
              _Hashtable<File_*,_File_*,_std::allocator<File_*>,_std::__detail::_Identity,_std::equal_to<File_*>,_std::hash<File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::~_Hashtable(&local_c0);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              ::~_Rb_tree(&local_f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_allocated_capacity != &local_100) {
                operator_delete((void *)local_110._M_allocated_capacity);
              }
              local_4f8 = pVar25.first.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                          ._M_cur.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
              ;
              iVar5 = open((__x->_M_dataplus)._M_p,0);
              __len = (string *)boost::filesystem::detail::file_size((path *)__x,(error_code *)0x0);
              local_454 = iVar5;
              __s = mmap((void *)0x0,(size_t)__len,1,2,iVar5,0);
              local_4b8 = __len;
              if (__len != (string *)0x0) {
                pcVar13 = (char *)memrchr(__s,0x23,(size_t)__len);
                __n_00 = __len;
                if (pcVar13 != (char *)0x0) {
                  iVar5 = strncmp(pcVar13,"#endif",6);
                  if (iVar5 == 0) {
                    pcVar13 = (char *)memrchr(__s,0x23,(size_t)(pcVar13 + ~(ulong)__s));
                  }
                  if (pcVar13 != (char *)0x0) {
                    pvVar14 = memchr(pcVar13,10,
                                     (long)__s + ((long)&__len->_M_dataplus - (long)pcVar13));
                    __n_00 = (string *)((long)pvVar14 - (long)__s);
                    if (pvVar14 == (void *)0x0) {
                      __n_00 = __len;
                    }
                  }
                }
                if ((char)local_450 != '\0') {
                  *(undefined8 *)
                   ((long)&((local_4f8._M_cur)->
                           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>
                           ._M_storage._M_storage + 0xe8) = 0;
                  if (__n_00 == (string *)0x0) goto LAB_00126f61;
                  puVar15 = (undefined1 *)0x0;
                  lVar9 = 0;
                  do {
                    if (*(char *)((long)__s + (long)puVar15) == '\n') {
                      lVar9 = lVar9 + 1;
                      *(long *)((long)&((local_4f8._M_cur)->
                                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                                       ).
                                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>
                                       ._M_storage._M_storage + 0xe8) = lVar9;
                    }
                    puVar15 = puVar15 + 1;
                  } while (__n_00 != (string *)puVar15);
                }
                if (__n_00 != (string *)0x0) {
                  local_4f8._M_cur =
                       (__node_type *)
                       ((long)&((local_4f8._M_cur)->
                               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>
                               ._M_storage._M_storage + 0x20);
                  local_4c8 = (string *)memchr(__s,0x2f,(size_t)__n_00);
                  local_508 = (undefined1 *)memchr(__s,0x23,(size_t)__n_00);
                  local_468 = (string *)((long)__s + 1);
                  local_4c0 = (undefined1 *)0x0;
                  puVar15 = (undefined1 *)0x0;
                  uVar22 = 0;
                  do {
                    switch(uVar22) {
                    case 0:
                      if (local_508 == (undefined1 *)0x0) {
                        local_508 = (undefined1 *)0x0;
                      }
                      else if (local_508 < (undefined1 *)((long)__s + (long)puVar15)) {
                        local_508 = (undefined1 *)
                                    memchr((undefined1 *)((long)__s + (long)puVar15),0x23,
                                           (long)__n_00 - (long)puVar15);
                      }
                      if (local_508 == (undefined1 *)0x0) goto LAB_00126f61;
                      if (local_4c8 == (string *)0x0) {
                        local_4c8 = (string *)0x0;
                      }
                      else if (local_4c8 < (undefined1 *)((long)__s + (long)puVar15)) {
                        local_4c8 = (string *)
                                    memchr((undefined1 *)((long)__s + (long)puVar15),0x2f,
                                           (long)__n_00 - (long)puVar15);
                      }
                      if ((local_4c8 == (string *)0x0) || (local_508 <= local_4c8)) {
                        puVar15 = local_508 + -(long)__s;
                        uVar22 = 1;
                      }
                      else {
                        puVar15 = (undefined1 *)((long)local_4c8 - (long)__s);
                        cVar20 = *(char *)((long)&(local_4c8->_M_dataplus)._M_p + 1);
                        uVar22 = 0;
                        if (cVar20 == '/') {
                          pvVar14 = memchr(local_4c8,10,(long)__n_00 - (long)puVar15);
                          puVar15 = (undefined1 *)((long)pvVar14 - (long)__s);
                        }
                        else if (cVar20 == '*') {
                          do {
                            pvVar14 = memchr(local_468 + (long)puVar15,0x2f,
                                             (long)__n_00 - (long)puVar15);
                            if (pvVar14 == (void *)0x0) goto LAB_00126f61;
                            puVar15 = (undefined1 *)((long)pvVar14 - (long)__s);
                          } while (*(char *)((long)pvVar14 + -1) != '*');
                        }
                      }
                      break;
                    case 1:
                      cVar20 = *(char *)((long)__s + (long)puVar15);
                      uVar22 = 1;
                      if ((cVar20 != '\t') && (cVar20 != ' ')) {
                        if (cVar20 == 'i') {
                          if (puVar15[(long)__s + 1] == 'n') {
                            if ((((puVar15[(long)__s + 2] == 'c') && (puVar15[(long)__s + 3] == 'l')
                                 ) && (puVar15[(long)__s + 4] == 'u')) &&
                               ((puVar15[(long)__s + 5] == 'd' && (puVar15[(long)__s + 6] == 'e'))))
                            {
                              puVar15 = puVar15 + 6;
                              goto LAB_00126f4a;
                            }
                          }
                          else if (((puVar15[(long)__s + 1] == 'm') &&
                                   (puVar15[(long)__s + 2] == 'p')) &&
                                  ((puVar15[(long)__s + 3] == 'o' &&
                                   ((puVar15[(long)__s + 4] == 'r' &&
                                    (puVar15[(long)__s + 5] == 't')))))) {
                            puVar15 = puVar15 + 5;
LAB_00126f4a:
                            uVar22 = 2;
                            break;
                          }
                        }
LAB_00126f52:
                        uVar22 = 0;
                      }
                      break;
                    case 2:
                      bVar1 = *(byte *)((long)__s + (long)puVar15);
                      if (bVar1 < 0x22) {
                        uVar22 = 2;
                        if ((bVar1 != 9) && (bVar1 != 0x20)) goto LAB_00126f52;
                      }
                      else if (bVar1 == 0x22) {
                        local_4c0 = puVar15 + 1;
                        uVar22 = 4;
                      }
                      else {
                        if (bVar1 != 0x3c) goto LAB_00126f52;
                        local_4c0 = puVar15 + 1;
                        uVar22 = 3;
                      }
                      break;
                    case 3:
                      cVar20 = *(char *)((long)__s + (long)puVar15);
                      if (cVar20 == '>') {
                        local_338._0_8_ = local_338 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_338,(undefined1 *)((long)__s + (long)local_4c0),
                                   (undefined1 *)((long)__s + (long)puVar15));
                        File::AddIncludeStmt((File *)local_4f8._M_cur,true,(string *)local_338);
                        goto LAB_00126ebd;
                      }
                      uVar22 = 3;
LAB_00126cdb:
                      if (cVar20 == '\n') goto LAB_00126f52;
                      break;
                    case 4:
                      cVar20 = *(char *)((long)__s + (long)puVar15);
                      if (cVar20 != '\"') {
                        uVar22 = 4;
                        goto LAB_00126cdb;
                      }
                      local_338._0_8_ = local_338 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_338,(undefined1 *)((long)__s + (long)local_4c0),
                                 (undefined1 *)((long)__s + (long)puVar15));
                      File::AddIncludeStmt((File *)local_4f8._M_cur,false,(string *)local_338);
LAB_00126ebd:
                      if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
                        operator_delete((void *)local_338._0_8_);
                      }
                      uVar22 = 0;
                    }
                    puVar15 = puVar15 + 1;
                  } while (puVar15 < __n_00);
                }
              }
LAB_00126f61:
              munmap(__s,(size_t)local_4b8);
              close(local_454);
            }
          }
          else {
            pCVar10 = AddComponentDefinition(local_4b0,(path *)(local_3c0 + 8));
            pCVar10->hasAddonCmake = true;
          }
        }
      }
    }
    else {
LAB_00126051:
      boost::filesystem::recursive_directory_iterator::disable_recursion_pending(&local_500,true);
    }
    if (local_488 != local_478) {
      operator_delete(local_488);
    }
    if ((error_category *)local_3c0._8_8_ != &local_3a8) {
      operator_delete((void *)local_3c0._8_8_);
    }
    boost::filesystem::detail::recursive_directory_iterator_increment(&local_500,(error_code *)0x0);
  } while( true );
}

Assistant:

void LoadFileList(const Configuration& config,
                  std::unordered_map<std::string, Component *> &components,
                  std::unordered_map<std::string, File>& files,
                  const filesystem::path& sourceDir,
                  bool inferredComponents,
                  bool withLoc) {
    filesystem::path outputpath = filesystem::current_path();
    filesystem::current_path(sourceDir.c_str());
    AddComponentDefinition(components, ".");
    for (filesystem::recursive_directory_iterator it("."), end;
         it != end; ++it) {
        const auto &parent = it->path().parent_path();

        // skip hidden files and dirs
        std::string fileName = it->path().filename().generic_string();
        if ((fileName.size() >= 2 && fileName[0] == '.') ||
            IsItemBlacklisted(config, it->path())) {
#ifdef WITH_BOOST
            it.no_push();
#else
            it.disable_recursion_pending();
#endif
            continue;
        }       

        if (inferredComponents) AddComponentDefinition(components, parent);

        if (it->path().filename() == "CMakeLists.txt") {
            ReadCmakelist(config, components, it->path());
        } else if (filesystem::is_regular_file(it->status())) {
            if (it->path().generic_string().find("CMakeAddon.txt") != std::string::npos) {
                AddComponentDefinition(components, parent).hasAddonCmake = true;
            } else if (IsCode(it->path().extension().generic_string())) {
                ReadCode(files, it->path(), withLoc);
            }
        }
    }
    filesystem::current_path(outputpath);
}